

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O0

void LoadSectors(sectortype *bsec)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  extsector_t *peVar9;
  ulong uVar10;
  double dVar11;
  double local_158;
  double local_140;
  double local_110;
  double local_f0;
  extsector_t *local_d8;
  sector_t *local_a0;
  TAngle<double> local_80;
  TAngle<double> local_78;
  int local_6c;
  int local_68;
  int local_64;
  double local_60;
  double ceilingheight;
  double local_50;
  double floorheight;
  int i;
  char local_31 [8];
  char tnam [9];
  sector_t *sec;
  FDynamicColormap *local_18;
  FDynamicColormap *map;
  sectortype *bsec_local;
  
  map = (FDynamicColormap *)bsec;
  PalEntry::PalEntry((PalEntry *)((long)&sec + 4),0xff,0xff,0xff);
  PalEntry::PalEntry((PalEntry *)&sec,level.fadeto);
  local_18 = GetSpecialLights((PalEntry)sec._4_4_,(PalEntry)sec._0_4_,0);
  uVar6 = (ulong)numsectors;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar7 = SUB168(auVar1 * ZEXT816(0x268),0);
  if (SUB168(auVar1 * ZEXT816(0x268),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  tnam._1_8_ = operator_new__(uVar7);
  if (uVar6 != 0) {
    local_a0 = (sector_t *)tnam._1_8_;
    do {
      sector_t::sector_t(local_a0);
      local_a0 = local_a0 + 1;
    } while (local_a0 != (sector_t *)(tnam._1_8_ + uVar6 * 0x268));
  }
  sectors = (sector_t *)tnam._1_8_;
  memset((void *)tnam._1_8_,0,(long)numsectors * 0x268);
  uVar6 = (ulong)numsectors;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar7 = SUB168(auVar2 * ZEXT816(0xb0),0);
  uVar10 = uVar7 + 8;
  if (SUB168(auVar2 * ZEXT816(0xb0),8) != 0 || 0xfffffffffffffff7 < uVar7) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar8 = (ulong *)operator_new__(uVar10);
  *puVar8 = uVar6;
  peVar9 = (extsector_t *)(puVar8 + 1);
  if (uVar6 != 0) {
    local_d8 = peVar9;
    do {
      extsector_t::extsector_t(local_d8);
      local_d8 = local_d8 + 1;
    } while (local_d8 != peVar9 + uVar6);
  }
  sectors->e = peVar9;
  for (floorheight._0_4_ = 0; floorheight._0_4_ < numsectors;
      floorheight._0_4_ = floorheight._0_4_ + 1) {
    *(undefined2 *)&map->Maps = *(undefined2 *)&map->Maps;
    *(undefined2 *)((long)&map->Maps + 2) = *(undefined2 *)((long)&map->Maps + 2);
    *(undefined2 *)&(map->Fade).field_0 = *(undefined2 *)&(map->Fade).field_0;
    *(undefined2 *)((long)&(map->Fade).field_0 + 2) =
         *(undefined2 *)((long)&(map->Fade).field_0 + 2);
    *(extsector_t **)(tnam._1_8_ + 0x200) = sectors->e + floorheight._0_4_;
    local_50 = (double)(int)-(map->Color).field_0.d / 256.0;
    sector_t::SetPlaneTexZ((sector_t *)tnam._1_8_,0,local_50,false);
    secplane_t::SetAtHeight((secplane_t *)(tnam._1_8_ + 0xb0),local_50,0);
    mysnprintf(local_31,9,"BTIL%04d");
    uVar3 = tnam._1_8_;
    ceilingheight._4_4_ = FTextureManager::GetTexture(&TexMan,local_31,5,0);
    sector_t::SetTexture((sector_t *)uVar3,0,ceilingheight._4_4_,true);
    local_f0 = 2.0;
    if (((map->Fade).field_0.d & 0x80000) == 0) {
      local_f0 = 1.0;
    }
    sector_t::SetXScale((sector_t *)tnam._1_8_,0,local_f0);
    local_110 = 2.0;
    if (((map->Fade).field_0.d & 0x80000) == 0) {
      local_110 = 1.0;
    }
    sector_t::SetYScale((sector_t *)tnam._1_8_,0,local_110);
    sector_t::SetXOffset((sector_t *)tnam._1_8_,0,(double)*(byte *)((long)&map->Next + 6) + 32.0);
    sector_t::SetYOffset((sector_t *)tnam._1_8_,0,(double)*(byte *)((long)&map->Next + 7) + 0.0);
    sector_t::SetPlaneLight((sector_t *)tnam._1_8_,0,*(char *)((long)&map->Next + 4) * -2 + 0xff);
    sector_t::ChangeFlags((sector_t *)tnam._1_8_,0,0,1);
    local_60 = (double)-*(int *)((long)&map->Maps + 4) / 256.0;
    sector_t::SetPlaneTexZ((sector_t *)tnam._1_8_,1,local_60,false);
    secplane_t::SetAtHeight((secplane_t *)(tnam._1_8_ + 0xd8),local_60,1);
    mysnprintf(local_31,9,"BTIL%04d");
    uVar3 = tnam._1_8_;
    local_64 = (int)FTextureManager::GetTexture(&TexMan,local_31,5,0);
    sector_t::SetTexture((sector_t *)uVar3,1,(FTextureID)local_64,true);
    if (((uint)(map->Fade).field_0 & 1) != 0) {
      sky1texture = sector_t::GetTexture((sector_t *)tnam._1_8_,1);
      local_6c = skyflatnum.texnum;
      sky2texture.texnum = sky1texture.texnum;
      local_68 = sky1texture.texnum;
      sector_t::SetTexture((sector_t *)tnam._1_8_,1,skyflatnum,true);
    }
    local_140 = 2.0;
    if (((uint)(map->Fade).field_0 & 8) == 0) {
      local_140 = 1.0;
    }
    sector_t::SetXScale((sector_t *)tnam._1_8_,1,local_140);
    local_158 = 2.0;
    if (((uint)(map->Fade).field_0 & 8) == 0) {
      local_158 = 1.0;
    }
    sector_t::SetYScale((sector_t *)tnam._1_8_,1,local_158);
    sector_t::SetXOffset((sector_t *)tnam._1_8_,1,(double)(byte)map->field_0x16 + 32.0);
    sector_t::SetYOffset((sector_t *)tnam._1_8_,1,(double)(byte)map->field_0x17 + 0.0);
    sector_t::SetPlaneLight((sector_t *)tnam._1_8_,1,(char)map->field_0x14 * -2 + 0xff);
    sector_t::ChangeFlags((sector_t *)tnam._1_8_,1,0,1);
    iVar4 = sector_t::GetPlaneLight((sector_t *)tnam._1_8_,0);
    iVar5 = sector_t::GetPlaneLight((sector_t *)tnam._1_8_,1);
    *(short *)(tnam._1_8_ + 0x112) = (short)((long)(iVar4 + iVar5) / 2);
    *(undefined2 *)(tnam._1_8_ + 0x114) = 0xffff;
    FNameNoInit::operator=((FNameNoInit *)(tnam._1_8_ + 0x11c),NAME_None);
    uVar3 = tnam._1_8_;
    *(undefined2 *)(tnam._1_8_ + 0x194) = 0xffff;
    *(undefined2 *)(tnam._1_8_ + 0x192) = 0xffff;
    *(undefined8 *)(tnam._1_8_ + 0x1c8) = 0x3ff0000000000000;
    *(undefined8 *)(tnam._1_8_ + 0x140) = 0x3fed000000000000;
    *(undefined8 *)(tnam._1_8_ + 0x148) = 0x3fa0000000000000;
    *(FDynamicColormap **)(tnam._1_8_ + 0x100) = local_18;
    *(undefined2 *)(tnam._1_8_ + 0x1dc) = 0xffff;
    *(undefined4 *)(tnam._1_8_ + 0x150) = 0xffffffff;
    *(undefined4 *)(tnam._1_8_ + 0x154) = 0xffffffff;
    if (((map->Fade).field_0.d & 0x40000) != 0) {
      TAngle<double>::TAngle(&local_78,90.0);
      sector_t::SetAngle((sector_t *)uVar3,0,&local_78);
      uVar3 = tnam._1_8_;
      dVar11 = sector_t::GetXScale((sector_t *)tnam._1_8_,0);
      sector_t::SetXScale((sector_t *)uVar3,0,-dVar11);
    }
    uVar3 = tnam._1_8_;
    if (((map->Fade).field_0.d & 0x100000) != 0) {
      dVar11 = sector_t::GetXScale((sector_t *)tnam._1_8_,0);
      sector_t::SetXScale((sector_t *)uVar3,0,-dVar11);
    }
    uVar3 = tnam._1_8_;
    if (((map->Fade).field_0.d & 0x200000) != 0) {
      dVar11 = sector_t::GetYScale((sector_t *)tnam._1_8_,0);
      sector_t::SetYScale((sector_t *)uVar3,0,-dVar11);
    }
    uVar3 = tnam._1_8_;
    if (((uint)(map->Fade).field_0 & 4) != 0) {
      TAngle<double>::TAngle(&local_80,90.0);
      sector_t::SetAngle((sector_t *)uVar3,1,&local_80);
      uVar3 = tnam._1_8_;
      dVar11 = sector_t::GetYScale((sector_t *)tnam._1_8_,1);
      sector_t::SetYScale((sector_t *)uVar3,1,-dVar11);
    }
    uVar3 = tnam._1_8_;
    if (((uint)(map->Fade).field_0 & 0x10) != 0) {
      dVar11 = sector_t::GetXScale((sector_t *)tnam._1_8_,1);
      sector_t::SetXScale((sector_t *)uVar3,1,-dVar11);
    }
    uVar3 = tnam._1_8_;
    if (((uint)(map->Fade).field_0 & 0x20) != 0) {
      dVar11 = sector_t::GetYScale((sector_t *)tnam._1_8_,1);
      sector_t::SetYScale((sector_t *)uVar3,1,-dVar11);
    }
    map = (FDynamicColormap *)&map[1].Color;
    tnam._1_8_ = tnam._1_8_ + 0x268;
  }
  return;
}

Assistant:

static void LoadSectors (sectortype *bsec)
{
	FDynamicColormap *map = GetSpecialLights (PalEntry (255,255,255), level.fadeto, 0);
	sector_t *sec;
	char tnam[9];

	sec = sectors = new sector_t[numsectors];
	memset (sectors, 0, sizeof(sector_t)*numsectors);

	sectors[0].e = new extsector_t[numsectors];

	for (int i = 0; i < numsectors; ++i, ++bsec, ++sec)
	{
		bsec->wallptr = WORD(bsec->wallptr);
		bsec->wallnum = WORD(bsec->wallnum);
		bsec->ceilingstat = WORD(bsec->ceilingstat);
		bsec->floorstat = WORD(bsec->floorstat);

		sec->e = &sectors[0].e[i];
		double floorheight = -LittleLong(bsec->floorZ) / 256.;
		sec->SetPlaneTexZ(sector_t::floor, floorheight);
		sec->floorplane.SetAtHeight(floorheight, sector_t::floor);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(bsec->floorpicnum));
		sec->SetTexture(sector_t::floor, TexMan.GetTexture (tnam, FTexture::TEX_Build));
		sec->SetXScale(sector_t::floor, (bsec->floorstat & 8) ? 2. : 1.);
		sec->SetYScale(sector_t::floor, (bsec->floorstat & 8) ? 2. : 1.);
		sec->SetXOffset(sector_t::floor, bsec->floorxpanning + 32.);
		sec->SetYOffset(sector_t::floor, bsec->floorypanning + 0.);
		sec->SetPlaneLight(sector_t::floor, SHADE2LIGHT (bsec->floorshade));
		sec->ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);

		double ceilingheight = -LittleLong(bsec->ceilingZ) / 256.;
		sec->SetPlaneTexZ(sector_t::ceiling, ceilingheight);
		sec->ceilingplane.SetAtHeight(ceilingheight, sector_t::ceiling);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(bsec->ceilingpicnum));
		sec->SetTexture(sector_t::ceiling, TexMan.GetTexture (tnam, FTexture::TEX_Build));
		if (bsec->ceilingstat & 1)
		{
			sky1texture = sky2texture = sec->GetTexture(sector_t::ceiling);
			sec->SetTexture(sector_t::ceiling, skyflatnum);
		}
		sec->SetXScale(sector_t::ceiling, (bsec->ceilingstat & 8) ? 2. : 1.);
		sec->SetYScale(sector_t::ceiling, (bsec->ceilingstat & 8) ? 2. : 1.);
		sec->SetXOffset(sector_t::ceiling, bsec->ceilingxpanning + 32.);
		sec->SetYOffset(sector_t::ceiling, bsec->ceilingypanning + 0.);
		sec->SetPlaneLight(sector_t::ceiling, SHADE2LIGHT (bsec->ceilingshade));
		sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);

		sec->lightlevel = (sec->GetPlaneLight(sector_t::floor) + sec->GetPlaneLight(sector_t::ceiling)) / 2;

		sec->seqType = -1;
		sec->SeqName = NAME_None;
		sec->nextsec = -1;
		sec->prevsec = -1;
		sec->gravity = 1.f;
		sec->friction = ORIG_FRICTION;
		sec->movefactor = ORIG_FRICTION_FACTOR;
		sec->ColorMap = map;
		sec->ZoneNumber = 0xFFFF;
		sec->terrainnum[sector_t::ceiling] = sec->terrainnum[sector_t::floor] = -1;

		if (bsec->floorstat & 4)
		{
			sec->SetAngle(sector_t::floor, DAngle(90.));
			sec->SetXScale(sector_t::floor, -sec->GetXScale(sector_t::floor));
		}
		if (bsec->floorstat & 16)
		{
			sec->SetXScale(sector_t::floor, -sec->GetXScale(sector_t::floor));
		}
		if (bsec->floorstat & 32)
		{
			sec->SetYScale(sector_t::floor, -sec->GetYScale(sector_t::floor));
		}

		if (bsec->ceilingstat & 4)
		{
			sec->SetAngle(sector_t::ceiling, DAngle(90.));
			sec->SetYScale(sector_t::ceiling, -sec->GetYScale(sector_t::ceiling));
		}
		if (bsec->ceilingstat & 16)
		{
			sec->SetXScale(sector_t::ceiling, -sec->GetXScale(sector_t::ceiling));
		}
		if (bsec->ceilingstat & 32)
		{
			sec->SetYScale(sector_t::ceiling, -sec->GetYScale(sector_t::ceiling));
		}
	}
}